

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O3

int __thiscall HighsNodeQueue::link(HighsNodeQueue *this,char *__from,char *__to)

{
  double dVar1;
  pointer pOVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar3;
  char *__to_00;
  RbTree<HighsNodeQueue::SuboptimalNodeRbTree> local_30;
  int64_t *local_28;
  HighsNodeQueue *local_20;
  
  pOVar2 = (this->nodes).
           super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar1 = pOVar2[(long)__from].lower_bound;
  local_20 = this;
  if (dVar1 < this->optimality_limit || dVar1 == this->optimality_limit) {
    local_30.rootNode = &this->hybridEstimRoot;
    local_28 = &this->hybridEstimMin;
    ::highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
              ((RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)&local_30,__from,__to);
    local_30.rootNode = &this->lowerRoot;
    local_28 = &this->lowerMin;
    local_20 = this;
    ::highs::RbTree<HighsNodeQueue::NodeLowerRbTree>::link
              ((RbTree<HighsNodeQueue::NodeLowerRbTree> *)&local_30,__from,__to_00);
    link_domchgs(this,(int64_t)__from);
    iVar3 = extraout_EAX_00;
  }
  else {
    pOVar2[(long)__from].estimate = INFINITY;
    local_30.rootNode = &this->suboptimalRoot;
    local_28 = &this->suboptimalMin;
    ::highs::RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link(&local_30,__from,__to);
    this->numSuboptimal = this->numSuboptimal + 1;
    link_domchgs(this,(int64_t)__from);
    ldexp(1.0,1 - (this->nodes).
                  super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)__from].depth);
    iVar3 = extraout_EAX;
  }
  return iVar3;
}

Assistant:

double HighsNodeQueue::link(int64_t node) {
  if (nodes[node].lower_bound > optimality_limit) {
    assert(nodes[node].estimate != kHighsInf);
    nodes[node].estimate = kHighsInf;
    link_suboptimal(node);
    link_domchgs(node);
    return std::ldexp(1.0, 1 - nodes[node].depth);
  }

  link_estim(node);
  link_lower(node);
  link_domchgs(node);
  return 0.0;
}